

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.hpp
# Opt level: O0

notes_iterator __thiscall
OPNMIDIplay::MIDIchannel::find_or_create_activenote(MIDIchannel *this,uint note)

{
  bool bVar1;
  iterator pos;
  undefined1 local_a8 [8];
  NoteInfo ni;
  uint note_local;
  MIDIchannel *this_local;
  notes_iterator it;
  
  this_local = (MIDIchannel *)find_activenote(this,note);
  bVar1 = pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_>::is_end
                    ((pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_> *)&this_local);
  if (bVar1) {
    local_a8[0] = (uint8_t)note;
    pos = pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::end(&this->activenotes);
    this_local = (MIDIchannel *)
                 pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::insert
                           (&this->activenotes,pos,(NoteInfo *)local_a8);
  }
  else {
    ni._120_8_ = this_local;
    cleanupNote(this,(notes_iterator)this_local);
  }
  return (notes_iterator)(pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)this_local;
}

Assistant:

notes_iterator find_or_create_activenote(unsigned note)
        {
            notes_iterator it = find_activenote(note);
            if(!it.is_end())
                cleanupNote(it);
            else
            {
                NoteInfo ni;
                ni.note = note;
                it = activenotes.insert(activenotes.end(), ni);
            }
            return it;
        }